

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void __thiscall
icu_63::RuleBasedBreakIterator::BreakCache::previous(BreakCache *this,UErrorCode *status)

{
  int iVar1;
  int iVar2;
  RuleBasedBreakIterator *pRVar3;
  uint uVar4;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  iVar1 = this->fBufIdx;
  if (iVar1 == this->fStartBufIdx) {
    populatePreceding(this,status);
  }
  else {
    uVar4 = iVar1 - 1U & 0x7f;
    this->fBufIdx = uVar4;
    this->fTextIdx = this->fBoundaries[uVar4];
  }
  iVar2 = this->fBufIdx;
  pRVar3 = this->fBI;
  pRVar3->fDone = iVar2 == iVar1;
  pRVar3->fPosition = this->fTextIdx;
  pRVar3->fRuleStatusIndex = (uint)this->fStatuses[iVar2];
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }